

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

void __thiscall SQVM::Mark(SQVM *this,SQCollectable **chain)

{
  SQUnsignedInteger i;
  ulong uVar1;
  long lVar2;
  long lVar3;
  
  uVar1 = (this->super_SQCollectable).super_SQRefCounted._uiRef;
  if (-1 < (int)uVar1) {
    (this->super_SQCollectable).super_SQRefCounted._uiRef = uVar1 | 0x80000000;
    SQSharedState::MarkObject(&this->_lasterror,(SQCollectable_conflict **)chain);
    SQSharedState::MarkObject(&this->_errorhandler,(SQCollectable_conflict **)chain);
    SQSharedState::MarkObject(&this->_debughook_closure,(SQCollectable_conflict **)chain);
    SQSharedState::MarkObject(&this->_roottable,(SQCollectable_conflict **)chain);
    SQSharedState::MarkObject(&this->temp_reg,(SQCollectable_conflict **)chain);
    lVar3 = 0;
    for (uVar1 = 0; uVar1 < (this->_stack)._size; uVar1 = uVar1 + 1) {
      SQSharedState::MarkObject
                ((SQObjectPtr *)((long)&(((this->_stack)._vals)->super_SQObject)._type + lVar3),
                 (SQCollectable_conflict **)chain);
      lVar3 = lVar3 + 0x10;
    }
    lVar3 = 0x10;
    for (lVar2 = 0; lVar2 < this->_callsstacksize; lVar2 = lVar2 + 1) {
      SQSharedState::MarkObject
                ((SQObjectPtr *)((long)&this->_callsstack->_ip + lVar3),
                 (SQCollectable_conflict **)chain);
      lVar3 = lVar3 + 0x48;
    }
    SQCollectable::RemoveFromChain(&this->_sharedstate->_gc_chain,(SQCollectable_conflict *)this);
    SQCollectable::AddToChain((SQCollectable_conflict **)chain,(SQCollectable_conflict *)this);
    return;
  }
  return;
}

Assistant:

void SQVM::Mark(SQCollectable **chain)
{
    START_MARK()
        SQSharedState::MarkObject(_lasterror,chain);
        SQSharedState::MarkObject(_errorhandler,chain);
        SQSharedState::MarkObject(_debughook_closure,chain);
        SQSharedState::MarkObject(_roottable, chain);
        SQSharedState::MarkObject(temp_reg, chain);
        for(SQUnsignedInteger i = 0; i < _stack.size(); i++) SQSharedState::MarkObject(_stack[i], chain);
        for(SQInteger k = 0; k < _callsstacksize; k++) SQSharedState::MarkObject(_callsstack[k]._closure, chain);
    END_MARK()
}